

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::seeDoes(Forth *this,AAddr does)

{
  undefined1 *puVar1;
  Cell CVar2;
  ostream *poVar3;
  Definition *pDVar4;
  Cell index;
  FCell FVar5;
  
  puVar1 = &this->field_0x20;
  do {
    while( true ) {
      while( true ) {
        index = does;
        CVar2 = dataSpaceAtCell(this,index);
        if (CVar2 == 4) {
          std::operator<<((ostream *)puVar1," ;");
          return;
        }
        CVar2 = dataSpaceAtCell(this,index);
        if ((CVar2 != 0) &&
           ((ulong)CVar2 <
            (ulong)(((long)(this->definitions).
                           super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->definitions).
                          super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x50))) break;
        poVar3 = std::operator<<((ostream *)puVar1," ");
        CVar2 = getNumericBase(this);
        poVar3 = std::operator<<(poVar3,CVar2);
        CVar2 = dataSpaceAtCell(this,index);
        std::ostream::operator<<(poVar3,CVar2);
        does = index + 4;
      }
      poVar3 = std::operator<<((ostream *)puVar1," ");
      pDVar4 = definitionsAt(this,CVar2);
      std::operator<<(poVar3,(string *)&pDVar4->name);
      does = index + 4;
      if (CVar2 - 5 < 2) break;
      if (CVar2 == 0x12) {
        std::operator<<((ostream *)puVar1," ");
        FVar5 = getDataFCell(this,does);
        std::ostream::_M_insert<double>(FVar5);
        does = index + 0xc;
      }
      else if (CVar2 == 1) break;
    }
    poVar3 = std::operator<<((ostream *)puVar1," ");
    dataSpaceAtCell(this,does);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    does = index + 8;
  } while( true );
}

Assistant:

void seeDoes(AAddr does) {
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			while (XT(getDataCell( does )) != endOfDefinitionXt) {
				auto xt = findXt(getDataCell(does));
				if (xt)
					std_cout << " " << definitionsAt(xt).name;
				else
					std_cout << " " << SETBASE() << static_cast<SCell>(getDataCell(does));
				does+=sizeof(Cell);	
				if(xt==branchXt || xt==zbranchXt || xt==doLiteralXt ){
				 
				 std_cout << " " <<  getDataCell(does)	;
				 does+=sizeof(Cell);
				} else 
				if( xt==doFLiteralXt ){
				 std_cout << " " <<  getDataFCell(does)	;
				 does+=sizeof(FCell);
				}	
				
			}
			std_cout << " ;";
#endif
		}